

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::updatePrimal(HEkkDual *this,HVector *DSE_Vector)

{
  pointer *ppiVar1;
  HVector *column;
  HVector *theta;
  bool bVar2;
  reference pvVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RSI;
  HEkk *in_RDI;
  double dVar5;
  double dVar6;
  double new_pivotal_edge_weight_1;
  double Kai;
  double new_pivotal_edge_weight;
  double pivot_in_scaled_space;
  bool ok_update_primal;
  double u_out;
  double l_out;
  double x_out;
  double updated_edge_weight;
  vector<double,_std::allocator<double>_> *edge_weight;
  double *in_stack_00000148;
  double in_stack_00000150;
  double in_stack_00000158;
  HVector *in_stack_00000160;
  HighsInt in_stack_00000168;
  HighsInt in_stack_0000016c;
  HEkk *in_stack_00000170;
  HighsInt in_stack_ffffffffffffff50;
  HighsInt in_stack_ffffffffffffff54;
  HVector *in_stack_ffffffffffffff58;
  HSimplexNla *in_stack_ffffffffffffff60;
  HVector *in_stack_ffffffffffffff78;
  HVector *column_00;
  HEkkDualRHS *in_stack_ffffffffffffff80;
  HEkkDualRHS *this_01;
  HVector *in_stack_ffffffffffffff88;
  double local_68;
  double local_60;
  double local_58;
  double in_stack_ffffffffffffffb0;
  HVector *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  HVector *in_stack_ffffffffffffffd0;
  HEkkDualRHS *in_stack_ffffffffffffffd8;
  
  if (*(int *)&(in_RDI->analysis_).log_options.user_callback.super__Function_base._M_manager == 0) {
    this_00 = &((HEkk *)in_RDI->timer_)->dual_edge_weight_;
    if (*(EdgeWeightMode *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) == kDevex) {
      std::vector<double,_std::allocator<double>_>::operator[]
                (this_00,(long)*(int *)&(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
      in_stack_ffffffffffffff88 =
           *(HVector **)&(in_RDI->analysis_).cleanup_primal_change_distribution.value_name_;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)*(int *)&(in_RDI->analysis_).cleanup_dual_step_distribution.
                                                 count_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start);
      *pvVar3 = (value_type)in_stack_ffffffffffffff88;
      bVar2 = newDevexFramework((HEkkDual *)in_RDI,(double)in_stack_ffffffffffffff88);
      *(bool *)&in_RDI->options_ = bVar2;
    }
    HEkkDualRHS::updatePrimal
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    HEkkDualRHS::updateInfeasList(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_01 = (HEkkDualRHS *)
              (*(double **)&(in_RDI->analysis_).model_name_)
              [*(int *)&(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start];
    column = (HVector *)
             (*(double **)&(in_RDI->analysis_).numRow)
             [*(int *)&(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start];
    theta = (HVector *)
            (*(double **)&(in_RDI->analysis_).numTot)
            [*(int *)&(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start];
    ppiVar1 = &(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    column_00 = theta;
    if ((double)*ppiVar1 <= 0.0 && (double)*ppiVar1 != 0.0) {
      column_00 = column;
    }
    *(double *)&(in_RDI->analysis_).cleanup_primal_change_distribution.distribution_name_ =
         ((double)this_01 - (double)column_00) /
         (double)(in_RDI->analysis_).cleanup_primal_change_distribution.distribution_name_.
                 _M_string_length;
    bVar2 = HEkkDualRHS::updatePrimal(this_01,column,(double)theta);
    if (bVar2) {
      HEkk::updateBadBasisChange
                ((HEkk *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      if (*(EdgeWeightMode *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) ==
          kSteepestEdge) {
        dVar5 = HSimplexNla::pivotInScaledSpace
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)*(int *)&(in_RDI->analysis_).
                                                   cleanup_dual_step_distribution.count_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start);
        dVar6 = *pvVar3 / (dVar5 * dVar5);
        local_58 = -2.0 / dVar5;
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x78a527);
        HEkk::updateDualSteepestEdgeWeights
                  (in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                   in_stack_00000158,in_stack_00000150,in_stack_00000148);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)*(int *)&(in_RDI->analysis_).
                                                   cleanup_dual_step_distribution.count_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start);
        *pvVar3 = dVar6;
      }
      else if (*(EdgeWeightMode *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) == kDevex)
      {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)*(int *)&(in_RDI->analysis_).
                                                   cleanup_dual_step_distribution.count_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start);
        local_60 = *pvVar3 / ((double)(in_RDI->analysis_).cleanup_primal_change_distribution.
                                      distribution_name_._M_string_length *
                             (double)(in_RDI->analysis_).cleanup_primal_change_distribution.
                                     distribution_name_._M_string_length);
        local_68 = 1.0;
        pdVar4 = std::max<double>(&local_68,&local_60);
        local_60 = *pdVar4;
        HEkk::updateDualDevexWeights(in_RDI,in_stack_ffffffffffffff88,(double)this_01);
        dVar5 = local_60;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)*(int *)&(in_RDI->analysis_).
                                                   cleanup_dual_step_distribution.count_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start);
        *pvVar3 = dVar5;
        *(HighsInt *)((long)&in_RDI->callback_ + 4) =
             *(HighsInt *)((long)&in_RDI->callback_ + 4) + 1;
      }
      HEkkDualRHS::updateInfeasList(this_01,column_00);
      ((HEkk *)in_RDI->timer_)->total_synthetic_tick_ =
           *(double *)
            &(in_RDI->analysis_).before_ftran_upper_sparse_density.distribution_name_.field_2 +
           ((HEkk *)in_RDI->timer_)->total_synthetic_tick_;
      ((HEkk *)in_RDI->timer_)->total_synthetic_tick_ =
           *(double *)(in_RSI + 0x38) + ((HEkk *)in_RDI->timer_)->total_synthetic_tick_;
    }
    else {
      *(HighsInt *)&(in_RDI->analysis_).log_options.user_callback.super__Function_base._M_manager =
           0xb;
    }
  }
  return;
}

Assistant:

void HEkkDual::updatePrimal(HVector* DSE_Vector) {
  // Update the primal values and any edge weights
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (edge_weight_mode == EdgeWeightMode::kDevex) {
    const double updated_edge_weight = edge_weight[row_out];
    edge_weight[row_out] = computed_edge_weight;
    new_devex_framework = newDevexFramework(updated_edge_weight);
  }
  // DSE_Vector is either col_DSE = B^{-1}B^{-T}e_p (if using dual
  // steepest edge weights) or row_ep = B^{-T}e_p.
  //
  // Update - primal and weight
  dualRHS.updatePrimal(&col_BFRT, 1);
  dualRHS.updateInfeasList(&col_BFRT);
  double x_out = baseValue[row_out];
  double l_out = baseLower[row_out];
  double u_out = baseUpper[row_out];
  theta_primal = (x_out - (delta_primal < 0 ? l_out : u_out)) / alpha_col;
  const bool ok_update_primal = dualRHS.updatePrimal(&col_aq, theta_primal);
  if (!ok_update_primal) {
    rebuild_reason = kRebuildReasonExcessivePrimalValue;
    return;
  }
  ekk_instance_.updateBadBasisChange(col_aq, theta_primal);
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    const double pivot_in_scaled_space =
        ekk_instance_.simplex_nla_.pivotInScaledSpace(&col_aq, variable_in,
                                                      row_out);
    if (ekk_instance_.simplex_in_scaled_space_)
      assert(pivot_in_scaled_space == alpha_col);
    const double new_pivotal_edge_weight =
        edge_weight[row_out] / (pivot_in_scaled_space * pivot_in_scaled_space);
    const double Kai = -2 / pivot_in_scaled_space;
    ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, &col_aq,
                                                new_pivotal_edge_weight, Kai,
                                                DSE_Vector->array.data());
    edge_weight[row_out] = new_pivotal_edge_weight;
  } else if (edge_weight_mode == EdgeWeightMode::kDevex) {
    // Pivotal row is for the current basis: weights are required for
    // the next basis so have to divide the current (exact) weight by
    // the pivotal value
    double new_pivotal_edge_weight =
        edge_weight[row_out] / (alpha_col * alpha_col);
    new_pivotal_edge_weight = max(1.0, new_pivotal_edge_weight);
    // nw_wt is max(use_edge_weight_[iRow], NewExactWeight*columnArray[iRow]^2);
    //
    // But NewExactWeight is new_pivotal_edge_weight = max(1.0,
    // edge_weight[row_out] / (alpha * alpha))
    //
    // so nw_wt = max(use_edge_weight_[iRow],
    // new_pivotal_edge_weight*columnArray[iRow]^2);
    //
    // Update rest of weights
    ekk_instance_.updateDualDevexWeights(&col_aq, new_pivotal_edge_weight);
    edge_weight[row_out] = new_pivotal_edge_weight;
    num_devex_iterations++;
  }
  dualRHS.updateInfeasList(&col_aq);

  // Whether or not dual steepest edge weights are being used, have to
  // add in DSE_Vector->synthetic_tick_ since this contains the
  // contribution from forming row_ep = B^{-T}e_p.
  ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
  ekk_instance_.total_synthetic_tick_ += DSE_Vector->synthetic_tick;
}